

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

void cache_tag(io_buf *cache,v_array<char> tag)

{
  char *__src;
  size_t sVar1;
  char **ppcVar2;
  io_buf *in_RDI;
  io_buf *unaff_retaddr;
  char *c;
  size_t *in_stack_fffffffffffffff0;
  size_t *psVar3;
  
  v_array<char>::size((v_array<char> *)&stack0x00000008);
  io_buf::buf_write(unaff_retaddr,(char **)in_RDI,(size_t)in_stack_fffffffffffffff0);
  sVar1 = v_array<char>::size((v_array<char> *)&stack0x00000008);
  *in_stack_fffffffffffffff0 = sVar1;
  psVar3 = in_stack_fffffffffffffff0 + 1;
  ppcVar2 = v_array<char>::begin((v_array<char> *)&stack0x00000008);
  __src = *ppcVar2;
  sVar1 = v_array<char>::size((v_array<char> *)&stack0x00000008);
  memcpy(in_stack_fffffffffffffff0 + 1,__src,sVar1);
  sVar1 = v_array<char>::size((v_array<char> *)&stack0x00000008);
  io_buf::set(in_RDI,(char *)(sVar1 + (long)psVar3));
  return;
}

Assistant:

void cache_tag(io_buf& cache, v_array<char> tag)
{
  char* c;
  cache.buf_write(c, sizeof(size_t) + tag.size());
  *(size_t*)c = tag.size();
  c += sizeof(size_t);
  memcpy(c, tag.begin(), tag.size());
  c += tag.size();
  cache.set(c);
}